

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O0

void __thiscall
TasGrid::GridLocalPolynomial::getDifferentiationWeights
          (GridLocalPolynomial *this,double *x,double *weights)

{
  pointer *this_00;
  bool bVar1;
  int __n;
  reference piVar2;
  reference pdVar3;
  MultiIndexSet *local_b0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_a0;
  int local_98;
  int local_94;
  int d;
  int i;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  iterator ibasis;
  undefined1 local_58 [8];
  vector<double,_std::allocator<double>_> diff_hbasis_values;
  vector<int,_std::allocator<int>_> active_points;
  MultiIndexSet *work;
  double *weights_local;
  double *x_local;
  GridLocalPolynomial *this_local;
  
  bVar1 = MultiIndexSet::empty(&(this->super_BaseCanonicalGrid).points);
  if (bVar1) {
    local_b0 = &(this->super_BaseCanonicalGrid).needed;
  }
  else {
    local_b0 = &(this->super_BaseCanonicalGrid).points;
  }
  ::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &diff_hbasis_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  ::std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_58);
  __n = MultiIndexSet::getNumIndexes(local_b0);
  ibasis._M_current = (double *)0x0;
  ::std::fill_n<double*,int,double>(weights,__n,(double *)&ibasis);
  walkTree<4>(this,local_b0,x,
              (vector<int,_std::allocator<int>_> *)
              &diff_hbasis_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,
              (vector<double,_std::allocator<double>_> *)local_58,(double *)0x0);
  __range1 = (vector<int,_std::allocator<int>_> *)
             ::std::vector<double,_std::allocator<double>_>::begin
                       ((vector<double,_std::allocator<double>_> *)local_58);
  this_00 = &diff_hbasis_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  __end1._M_current =
       (int *)::std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)this_00);
  _d = ::std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                               &d);
    if (!bVar1) break;
    piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end1);
    local_94 = *piVar2;
    for (local_98 = 0; local_98 < (this->super_BaseCanonicalGrid).num_dimensions;
        local_98 = local_98 + 1) {
      local_a0 = __gnu_cxx::
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                 operator++((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                             *)&__range1,0);
      pdVar3 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator*(&local_a0);
      weights[local_94 * (this->super_BaseCanonicalGrid).num_dimensions + local_98] = *pdVar3;
    }
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  applyTransformationTransposed<1>
            (this,weights,local_b0,
             (vector<int,_std::allocator<int>_> *)
             &diff_hbasis_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  ::std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_58);
  ::std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &diff_hbasis_values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void GridLocalPolynomial::getDifferentiationWeights(const double x[], double weights[]) const {
    // Based on GridLocalPolynomial::getInterpolationWeights().
    const MultiIndexSet &work = (points.empty()) ? needed : points;

    std::vector<int> active_points;
    std::vector<double> diff_hbasis_values;
    std::fill_n(weights, work.getNumIndexes(), 0.0);

    walkTree<4>(work, x, active_points, diff_hbasis_values, nullptr);
    auto ibasis = diff_hbasis_values.begin();
    for(auto i : active_points)
        for (int d=0; d<num_dimensions; d++)
            weights[i * num_dimensions + d] = *ibasis++;
    applyTransformationTransposed<1>(weights, work, active_points);
}